

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_panel.cxx
# Opt level: O0

Fl_Double_Window * make_codeblock_panel(void)

{
  int minw;
  int minh;
  int maxw;
  int maxh;
  Fl_Window *this;
  Fl_Widget *pFVar1;
  Fl_Group *pFVar2;
  Fl_Window *this_00;
  Fl_Button *this_01;
  Fl_Group *this_02;
  Fl_Box *o_2;
  Fl_Group *o_1;
  Fl_Double_Window *o;
  
  this = (Fl_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window((Fl_Double_Window *)this,300,0x73,"Code Block Properties");
  codeblock_panel = (Fl_Double_Window *)this;
  Fl_Widget::labelsize((Fl_Widget *)this,0xb);
  pFVar1 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar1,10,0xf,0x118,0x14,"Conditional code block");
  code_before_input = (Fl_Input *)pFVar1;
  Fl_Widget::tooltip(pFVar1,"#ifdef or similar conditional code block.");
  Fl_Widget::labelsize((Fl_Widget *)code_before_input,0xb);
  Fl_Input_::textfont(&code_before_input->super_Fl_Input_,4);
  Fl_Input_::textsize(&code_before_input->super_Fl_Input_,0xb);
  Fl_Widget::align((Fl_Widget *)code_before_input,5);
  Fl_Widget::when((Fl_Widget *)code_before_input,'\0');
  pFVar1 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar1,10,0x37,0x118,0x14,"\"{...child code...}\" is inserted here"
                    );
  code_after_input = (Fl_Input *)pFVar1;
  Fl_Widget::tooltip(pFVar1,"#endif or similar conditional code block.");
  Fl_Widget::labelsize((Fl_Widget *)code_after_input,0xb);
  Fl_Input_::textfont(&code_after_input->super_Fl_Input_,4);
  Fl_Input_::textsize(&code_after_input->super_Fl_Input_,0xb);
  Fl_Widget::align((Fl_Widget *)code_after_input,5);
  Fl_Widget::when((Fl_Widget *)code_after_input,'\0');
  pFVar2 = Fl_Group::current();
  Fl_Group::resizable(pFVar2,(Fl_Widget *)code_after_input);
  pFVar2 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar2,10,0x55,0x118,0x14,(char *)0x0);
  pFVar1 = (Fl_Widget *)operator_new(0x80);
  Fl_Return_Button::Fl_Return_Button((Fl_Return_Button *)pFVar1,0xa0,0x55,0x3c,0x14,"OK");
  codeblock_panel_ok = (Fl_Return_Button *)pFVar1;
  Fl_Widget::labelsize(pFVar1,0xb);
  this_00 = Fl_Widget::window((Fl_Widget *)codeblock_panel_ok);
  Fl_Window::hotspot(this_00,(Fl_Widget *)codeblock_panel_ok,0);
  this_01 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(this_01,0xe6,0x55,0x3c,0x14,"Cancel");
  codeblock_panel_cancel = this_01;
  Fl_Button::shortcut(this_01,0xff1b);
  Fl_Widget::labelsize(&codeblock_panel_cancel->super_Fl_Widget,0xb);
  pFVar1 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar1,10,0x55,0x8c,0x14,(char *)0x0);
  this_02 = Fl_Group::current();
  Fl_Group::resizable(this_02,pFVar1);
  Fl_Group::end(pFVar2);
  minw = Fl_Widget::w((Fl_Widget *)this);
  minh = Fl_Widget::h((Fl_Widget *)this);
  maxw = Fl::w();
  maxh = Fl_Widget::h((Fl_Widget *)this);
  Fl_Window::size_range(this,minw,minh,maxw,maxh,0,0,0);
  Fl_Window::set_modal(&codeblock_panel->super_Fl_Window);
  Fl_Group::end((Fl_Group *)codeblock_panel);
  return codeblock_panel;
}

Assistant:

Fl_Double_Window* make_codeblock_panel() {
  { Fl_Double_Window* o = codeblock_panel = new Fl_Double_Window(300, 115, "Code Block Properties");
    codeblock_panel->labelsize(11);
    { code_before_input = new Fl_Input(10, 15, 280, 20, "Conditional code block");
      code_before_input->tooltip("#ifdef or similar conditional code block.");
      code_before_input->labelsize(11);
      code_before_input->textfont(4);
      code_before_input->textsize(11);
      code_before_input->align(Fl_Align(FL_ALIGN_TOP_LEFT));
      code_before_input->when(FL_WHEN_NEVER);
    } // Fl_Input* code_before_input
    { code_after_input = new Fl_Input(10, 55, 280, 20, "\"{...child code...}\" is inserted here");
      code_after_input->tooltip("#endif or similar conditional code block.");
      code_after_input->labelsize(11);
      code_after_input->textfont(4);
      code_after_input->textsize(11);
      code_after_input->align(Fl_Align(FL_ALIGN_TOP_LEFT));
      code_after_input->when(FL_WHEN_NEVER);
      Fl_Group::current()->resizable(code_after_input);
    } // Fl_Input* code_after_input
    { Fl_Group* o = new Fl_Group(10, 85, 280, 20);
      { codeblock_panel_ok = new Fl_Return_Button(160, 85, 60, 20, "OK");
        codeblock_panel_ok->labelsize(11);
        codeblock_panel_ok->window()->hotspot(codeblock_panel_ok);
      } // Fl_Return_Button* codeblock_panel_ok
      { codeblock_panel_cancel = new Fl_Button(230, 85, 60, 20, "Cancel");
        codeblock_panel_cancel->shortcut(0xff1b);
        codeblock_panel_cancel->labelsize(11);
      } // Fl_Button* codeblock_panel_cancel
      { Fl_Box* o = new Fl_Box(10, 85, 140, 20);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    o->size_range(o->w(), o->h(), Fl::w(), o->h());
    codeblock_panel->set_modal();
    codeblock_panel->end();
  } // Fl_Double_Window* codeblock_panel
  return codeblock_panel;
}